

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexWriterBase::getError(PtexWriterBase *this,String *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&this->_error,"\nPtex file: ");
  std::operator+(&local_58,&local_38,&this->_path);
  std::__cxx11::string::assign((char *)error);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void getError(Ptex::String& error) {
        error = (_error + "\nPtex file: " + _path).c_str();
    }